

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

uint32 google::protobuf::internal::DecodeTwoBytes(char **ptr)

{
  unsigned_short uVar1;
  uint uVar2;
  int iVar3;
  long *in_RDI;
  uint32_t x;
  uint32 value;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  uVar1 = UnalignedLoad<unsigned_short>
                    ((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  uVar2 = (uint)(char)uVar1;
  iVar3 = 1;
  if (uVar2 + uVar1 < uVar2) {
    iVar3 = 2;
  }
  *in_RDI = *in_RDI + (long)iVar3;
  return uVar2 + uVar1 & uVar2 * 2;
}

Assistant:

inline uint32 DecodeTwoBytes(const char** ptr) {
  uint32 value = UnalignedLoad<uint16>(*ptr);
  // Sign extend the low byte continuation bit
  uint32_t x = static_cast<int8_t>(value);
  // This add is an amazing operation, it cancels the low byte continuation bit
  // from y transferring it to the carry. Simultaneously it also shifts the 7
  // LSB left by one tightly against high byte varint bits. Hence value now
  // contains the unpacked value shifted left by 1.
  value += x;
  // Use the carry to update the ptr appropriately.
  *ptr += value < x ? 2 : 1;
  return value & (x + x);  // Mask out the high byte iff no continuation
}